

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
randomx::AssemblyGeneratorX86::h_ISUB_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  uint32_t uVar1;
  ostream *poVar2;
  void *this_00;
  int in_EDX;
  Instruction *in_RSI;
  AssemblyGeneratorX86 *in_RDI;
  
  in_RDI->registerUsage[in_RSI->dst] = in_EDX;
  if (in_RSI->src == in_RSI->dst) {
    poVar2 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tsub ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)in_RSI->dst * 8));
    poVar2 = std::operator<<(poVar2,", ");
    uVar1 = Instruction::getImm32((Instruction *)0x10d917);
    this_00 = (void *)std::ostream::operator<<(poVar2,uVar1);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tsub ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)in_RSI->dst * 8));
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)in_RSI->src * 8));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  traceint(in_RDI,in_RSI);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_ISUB_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			asmCode << "\tsub " << regR[instr.dst] << ", " << regR[instr.src] << std::endl;
		}
		else {
			asmCode << "\tsub " << regR[instr.dst] << ", " << (int32_t)instr.getImm32() << std::endl;
		}
		traceint(instr);
	}